

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

int32_t ggml_get_i32_1d(ggml_tensor *tensor,int i)

{
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    goto switchD_00124599_caseD_0;
  case GGML_TYPE_Q4_1:
switchD_00124599_caseD_1:
    ggml_get_i32_1d_cold_7();
  case GGML_TYPE_COUNT:
    ggml_get_i32_1d_cold_1();
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      return (int)*(char *)((long)tensor->data + (long)i);
    }
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      return (int)*(short *)((long)tensor->data + (long)i * 2);
    }
    ggml_get_i32_1d_cold_5();
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      return *(int32_t *)((long)tensor->data + (long)i * 4);
    }
    goto LAB_00124631;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      return (int)table_f32_f16[*(ushort *)((long)tensor->data + (long)i * 2)];
    }
    goto LAB_00124636;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      return (int)*(float *)((long)tensor->data + (long)i * 4);
    }
    goto LAB_0012462c;
  default:
    return 0;
  }
  ggml_get_i32_1d_cold_6();
LAB_0012462c:
  ggml_get_i32_1d_cold_2();
LAB_00124631:
  ggml_get_i32_1d_cold_4();
LAB_00124636:
  ggml_get_i32_1d_cold_3();
switchD_00124599_caseD_0:
  ggml_get_i32_1d_cold_8();
  goto switchD_00124599_caseD_1;
}

Assistant:

int32_t ggml_get_i32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}